

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_prepare.cpp
# Opt level: O2

unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true> __thiscall
duckdb::Transformer::TransformPrepare(Transformer *this,PGPrepareStmt *stmt)

{
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var1;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var2;
  pointer pPVar3;
  NotImplementedException *this_00;
  long in_RDX;
  allocator local_49;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_48;
  
  if ((*(long *)(in_RDX + 0x10) != 0) && (0 < *(int *)(*(long *)(in_RDX + 0x10) + 4))) {
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb8,
               "Prepared statement argument types are not supported, use CAST",&local_49);
    NotImplementedException::NotImplementedException(this_00,(string *)&stack0xffffffffffffffb8);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  make_uniq<duckdb::PrepareStatement>();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb8,*(char **)(in_RDX + 8),&local_49);
  pPVar3 = unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
           ::operator->((unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
                         *)this);
  ::std::__cxx11::string::operator=((string *)&pPVar3->name,(string *)&stack0xffffffffffffffb8);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  TransformStatement((Transformer *)&stack0xffffffffffffffb8,(PGNode *)stmt);
  pPVar3 = unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
           ::operator->((unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
                         *)this);
  _Var2._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (SQLStatement *)0x0;
  _Var1._M_head_impl =
       (pPVar3->statement).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (pPVar3->statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_SQLStatement + 8))();
    if ((Transformer *)local_48._M_head_impl != (Transformer *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  ClearParameters((Transformer *)stmt);
  return (unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>_>)
         (unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>_>)this;
}

Assistant:

unique_ptr<PrepareStatement> Transformer::TransformPrepare(duckdb_libpgquery::PGPrepareStmt &stmt) {
	if (stmt.argtypes && stmt.argtypes->length > 0) {
		throw NotImplementedException("Prepared statement argument types are not supported, use CAST");
	}

	auto result = make_uniq<PrepareStatement>();
	result->name = string(stmt.name);
	result->statement = TransformStatement(*stmt.query);
	ClearParameters();

	return result;
}